

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::SetSimpleJitCallCount(FunctionBody *this,uint16 simpleJitLimit)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionEntryPointInfo *pFVar5;
  FunctionEntryPointInfo *pFVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  
  uVar8 = (uint)simpleJitLimit;
  EVar2 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
  if (EVar2 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b8a,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) goto LAB_0077ae54;
    *puVar4 = 0;
  }
  pFVar5 = GetDefaultFunctionEntryPointInfo(this);
  pFVar6 = (FunctionEntryPointInfo *)
           FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
  if (pFVar5 != pFVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b8b,
                                "(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo())"
                                ,
                                "GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar3) {
LAB_0077ae54:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (0xfe < simpleJitLimit) {
    uVar8 = 0xff;
  }
  iVar9 = 0;
  if (simpleJitLimit != 0) {
    iVar9 = uVar8 - 1;
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
  *(int *)((long)pvVar7 + 0x7c) = iVar9;
  return;
}

Assistant:

void FunctionBody::SetSimpleJitCallCount(const uint16 simpleJitLimit) const
    {
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
        Assert(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo());

        // Simple JIT counts down and transitions on overflow
        const uint8 limit = static_cast<uint8>(min(0xffui16, simpleJitLimit));
        GetSimpleJitEntryPointInfo()->callsCount = limit == 0 ? 0 : limit - 1;
    }